

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O3

void __thiscall
nuraft::nuraft_global_mgr::commit_worker_loop(nuraft_global_mgr *this,ptr<worker_handle> *handle)

{
  mutex *__mutex;
  list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
  *this_00;
  ulong __val;
  _List_node_base *p_Var1;
  element_type *peVar2;
  raft_server *prVar3;
  nuraft_global_mgr *pnVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  pthread_t __target_thread;
  undefined4 extraout_var;
  ulong uVar9;
  long *plVar10;
  char cVar11;
  bool bVar12;
  ptr<raft_server> target;
  string __str;
  string thread_name;
  raft_server *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_b0 [2];
  string local_a0;
  nuraft_global_mgr *local_80;
  size_t local_78;
  ptr<raft_server> local_70;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  ptr<worker_handle> *local_40;
  _Hashtable<std::shared_ptr<nuraft::raft_server>,_std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_38;
  
  __val = ((handle->
           super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>)
          ._M_ptr)->id_;
  cVar11 = '\x01';
  if (9 < __val) {
    uVar9 = __val;
    cVar5 = '\x04';
    do {
      cVar11 = cVar5;
      if (uVar9 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_0020de35;
      }
      if (uVar9 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_0020de35;
      }
      if (uVar9 < 10000) goto LAB_0020de35;
      bVar12 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar5 = cVar11 + '\x04';
    } while (bVar12);
    cVar11 = cVar11 + '\x01';
  }
LAB_0020de35:
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_80 = this;
  std::__cxx11::string::_M_construct((ulong)&local_a0,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_a0._M_dataplus._M_p,(uint)local_a0._M_string_length,__val);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x4c27d0);
  local_60 = &local_50;
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_50 = *plVar10;
    lStack_48 = plVar8[3];
  }
  else {
    local_50 = *plVar10;
    local_60 = (long *)*plVar8;
  }
  local_58 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,(char *)local_60);
  if (((((handle->
         super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr)->stopping_)._M_base._M_i & 1U) == 0) {
    __mutex = &local_80->commit_queue_lock_;
    this_00 = &local_80->commit_queue_;
    local_38 = &(local_80->commit_server_set_)._M_h;
    do {
      LOCK();
      (((handle->
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->status_)._M_i = SLEEPING;
      UNLOCK();
      EventAwaiter::wait_us
                (&((handle->
                   super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->ea_,1000000);
      LOCK();
      (((handle->
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->ea_).status._M_i = idle;
      UNLOCK();
      LOCK();
      (((handle->
        super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->status_)._M_i = WORKING;
      UNLOCK();
      do {
        if (((((handle->
               super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->stopping_)._M_base._M_i & 1U) != 0) goto LAB_0020deee;
        local_b8 = (raft_server *)0x0;
        a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (iVar7 != 0) {
          std::__throw_system_error(iVar7);
        }
        p_Var1 = (this_00->
                 super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        if (p_Var1 == (_List_node_base *)this_00) {
          bVar12 = false;
          local_78 = 0;
        }
        else {
          local_b8 = (raft_server *)p_Var1[1]._M_next;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (a_Stack_b0,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var1[1]._M_prev);
          std::
          _Hashtable<std::shared_ptr<nuraft::raft_server>,_std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(local_38,&local_b8);
          pnVar4 = local_80;
          std::__cxx11::
          list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
          ::_M_erase(this_00,(local_80->commit_queue_).
                             super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                             ._M_impl._M_node.super__List_node_base._M_next);
          local_78 = (pnVar4->commit_queue_).
                     super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                     ._M_impl._M_node._M_size;
          bVar12 = (pnVar4->commit_queue_).
                   super__List_base<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this_00;
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        prVar3 = local_b8;
        if (local_b8 != (raft_server *)0x0) {
          peVar2 = (local_b8->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 5 < iVar7))
          {
            peVar2 = (prVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_(&local_a0,"execute commit for %p");
            (*peVar2->_vptr_logger[8])
                      (peVar2,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                       ,"commit_worker_loop",0x13a,&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p);
            }
          }
          if (((local_b8->sm_commit_paused_)._M_base._M_i & 1U) == 0) {
            bVar12 = true;
            if (((local_b8->sm_commit_index_).super___atomic_base<unsigned_long>._M_i <
                 (local_b8->quick_commit_index_).super___atomic_base<unsigned_long>._M_i) &&
               (iVar7 = (*((local_b8->log_store_).
                           super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->_vptr_log_store[2])(),
               (local_b8->sm_commit_index_).super___atomic_base<unsigned_long>._M_i <
               CONCAT44(extraout_var,iVar7) - 1U)) {
              peVar2 = (prVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if ((peVar2 != (element_type *)0x0) &&
                 (iVar7 = (*peVar2->_vptr_logger[7])(), 5 < iVar7)) {
                peVar2 = (prVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                local_40 = handle;
                msg_if_given_abi_cxx11_
                          (&local_a0,"execute commit by global worker, queue length %zu",local_78);
                (*peVar2->_vptr_logger[8])
                          (peVar2,6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                           ,"commit_worker_loop",0x14a,&local_a0);
                handle = local_40;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p);
                  handle = local_40;
                }
              }
              bVar6 = raft_server::commit_in_bg_exec
                                (local_b8,(local_80->config_).max_scheduling_unit_ms_);
              peVar2 = (prVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if (bVar6) {
                if ((peVar2 != (element_type *)0x0) &&
                   (iVar7 = (*peVar2->_vptr_logger[7])(), 5 < iVar7)) {
                  peVar2 = (prVar3->l_).
                           super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  msg_if_given_abi_cxx11_(&local_a0,"executed in time");
                  (*peVar2->_vptr_logger[8])
                            (peVar2,6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                             ,"commit_worker_loop",0x154,&local_a0);
                  goto LAB_0020e102;
                }
              }
              else {
                if ((peVar2 != (element_type *)0x0) &&
                   (iVar7 = (*peVar2->_vptr_logger[7])(), 5 < iVar7)) {
                  peVar2 = (prVar3->l_).
                           super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  msg_if_given_abi_cxx11_
                            (&local_a0,"couldn\'t finish in time (%zu ms), re-push to queue",
                             (local_80->config_).max_scheduling_unit_ms_);
                  (*peVar2->_vptr_logger[8])
                            (peVar2,6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                             ,"commit_worker_loop",0x151,&local_a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                    operator_delete(local_a0._M_dataplus._M_p);
                  }
                }
                local_70.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = local_b8;
                local_70.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = a_Stack_b0[0]._M_pi;
                if (a_Stack_b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (a_Stack_b0[0]._M_pi)->_M_use_count = (a_Stack_b0[0]._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (a_Stack_b0[0]._M_pi)->_M_use_count = (a_Stack_b0[0]._M_pi)->_M_use_count + 1;
                  }
                }
                request_commit(local_80,&local_70);
                if (local_70.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_70.
                             super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
              }
            }
          }
          else {
            peVar2 = (prVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            bVar12 = true;
            if ((peVar2 != (element_type *)0x0) && (iVar7 = (*peVar2->_vptr_logger[7])(), 5 < iVar7)
               ) {
              peVar2 = (prVar3->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              msg_if_given_abi_cxx11_(&local_a0,"commit of this server has been paused");
              (*peVar2->_vptr_logger[8])
                        (peVar2,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                         ,"commit_worker_loop",0x13d,&local_a0);
LAB_0020e102:
              bVar12 = true;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p);
              }
            }
          }
        }
        if (a_Stack_b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_b0[0]._M_pi);
        }
        if (((((handle->
               super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->stopping_)._M_base._M_i & 1U) != 0) goto LAB_0020deee;
      } while (bVar12);
    } while( true );
  }
LAB_0020deee:
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  return;
}

Assistant:

void nuraft_global_mgr::commit_worker_loop(ptr<worker_handle> handle) {
    std::string thread_name = "nuraft_g_c" + std::to_string(handle->id_);
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    bool skip_sleeping = false;
    while (!handle->stopping_) {
        if (!skip_sleeping) {
            handle->status_ = worker_handle::SLEEPING;
            // Wake up for every 1 second even without invoke, just in case.
            handle->ea_.wait_ms(1000);
            handle->ea_.reset();
            handle->status_ = worker_handle::WORKING;
        }
        if (handle->stopping_) break;

        skip_sleeping = false;
        size_t queue_length = 0;
        ptr<raft_server> target = nullptr;
        {
            std::lock_guard<std::mutex> l(commit_queue_lock_);
            auto entry = commit_queue_.begin();
            if (entry != commit_queue_.end()) {
                target = *entry;
                commit_server_set_.erase(target);
                commit_queue_.pop_front();
                queue_length = commit_queue_.size();
                if (!commit_queue_.empty()) {
                    // Other requests are waiting in the queue,
                    // skip sleeping next time.
                    skip_sleeping = true;
                }
            }
        }
        if (!target) continue;

        ptr<logger>& l_ = target->l_;

        // Whenever we find a task to execute, skip next sleeping for any tasks
        // that can be queued in the meantime.
        skip_sleeping = true;

        p_tr("execute commit for %p", target.get());

        if (target->sm_commit_paused_) {
            p_tr("commit of this server has been paused");
            // Since there can be other Raft server waiting for being served,
            // need to skip nest sleep.
            continue;
        }

        if ( target->quick_commit_index_ <= target->sm_commit_index_ ||
             target->log_store_->next_slot() - 1 <= target->sm_commit_index_ ) {
            // State machine's commit index is large enough not to execute commit
            // (see the comment in `commit_in_bg()`).
            continue;
        }

        p_tr("execute commit by global worker, queue length %zu", queue_length);
        bool finished_in_time =
            target->commit_in_bg_exec(config_.max_scheduling_unit_ms_);
        if (!finished_in_time) {
            // Commit took too long time and aborted in the middle.
            // Put this server to queue again.
            p_tr("couldn't finish in time (%zu ms), re-push to queue",
                 config_.max_scheduling_unit_ms_);
            request_commit(target);
        } else {
            p_tr("executed in time");
        }
    }
}